

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformBidec(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *__ptr;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vTruth;
  int *piVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  Bdc_Par_t Pars;
  Bdc_Par_t local_68;
  Bdc_Man_t *local_58;
  Vec_Int_t *local_50;
  Gia_Man_t *local_48;
  Gia_Obj_t *local_40;
  long local_38;
  
  local_68.fVeryVerbose = 0;
  local_68.nVarsMax = 0;
  local_68.fVerbose = 0;
  local_68.nVarsMax = Gia_ManLutSizeMax(p);
  local_68.fVerbose = fVerbose;
  if (local_68.nVarsMax < 2) {
    pcVar13 = "Resynthesis is not performed when nodes have less than 2 inputs.";
  }
  else {
    if (local_68.nVarsMax < 0x10) {
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      vTruth = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 0;
      pVVar3->nSize = 0;
      pVVar3->pArray = (int *)0x0;
      vTruth->nCap = 0x10000;
      vTruth->nSize = 0;
      local_50 = pVVar3;
      piVar4 = (int *)malloc(0x40000);
      vTruth->pArray = piVar4;
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nCap = 0;
      pVVar3->nSize = 0;
      pVVar3->pArray = (int *)0x0;
      Gia_ManCleanTruth(p);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      p_00 = Gia_ManStart(p->nObjs);
      pcVar13 = p->pName;
      if (pcVar13 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        sVar5 = strlen(pcVar13);
        pcVar6 = (char *)malloc(sVar5 + 1);
        strcpy(pcVar6,pcVar13);
      }
      p_00->pName = pcVar6;
      pcVar13 = p->pSpec;
      if (pcVar13 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        sVar5 = strlen(pcVar13);
        pcVar6 = (char *)malloc(sVar5 + 1);
        strcpy(pcVar6,pcVar13);
      }
      p_00->pSpec = pcVar6;
      Gia_ManHashAlloc(p_00);
      local_58 = Bdc_ManAlloc(&local_68);
      if (1 < p->nObjs) {
        lVar15 = 1;
        lVar16 = 0xc;
        local_48 = p;
        do {
          pGVar18 = p->pObjs;
          uVar17 = (uint)*(ulong *)(&pGVar18->field_0x0 + lVar16);
          if ((uVar17 & 0x9fffffff) == 0x9fffffff) {
            pGVar7 = Gia_ManAppendObj(p_00);
            uVar8 = *(ulong *)pGVar7;
            *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
            *(ulong *)pGVar7 =
                 uVar8 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar9 = p_00->pObjs;
            if ((pGVar7 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar7)) {
LAB_0070544a:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar9) >> 2) * -0x55555555);
            pGVar9 = p_00->pObjs;
            if ((pGVar7 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar7)) goto LAB_0070544a;
            iVar2 = (int)((ulong)((long)pGVar7 - (long)pGVar9) >> 2) * 0x55555556;
LAB_00705330:
            *(int *)((long)&pGVar18->Value + lVar16) = iVar2;
          }
          else {
            uVar8 = *(ulong *)(&pGVar18->field_0x0 + lVar16) & 0x1fffffff;
            if (uVar8 != 0x1fffffff && (int)uVar17 < 0) {
              uVar1 = *(uint *)((long)pGVar18 + lVar16 + (ulong)(uint)((int)uVar8 << 2) * -3 + 8);
              local_38 = lVar15;
              if ((int)uVar1 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar14 = uVar1 >> 1;
              if (p_00->nObjs <= (int)uVar14) {
                __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
              }
              local_40 = pGVar18;
              if ((~*(uint *)(p_00->pObjs + uVar14) & 0x1fffffff) != 0 &&
                  (int)*(uint *)(p_00->pObjs + uVar14) < 0) {
                __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
              }
              pGVar9 = Gia_ManAppendObj(p_00);
              uVar8 = *(ulong *)pGVar9;
              *(ulong *)pGVar9 = uVar8 | 0x80000000;
              pGVar18 = p_00->pObjs;
              if ((pGVar9 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar9)) goto LAB_0070544a;
              uVar11 = (ulong)(((uint)((int)pGVar9 - (int)pGVar18) >> 2) * -0x55555555 - uVar14 &
                              0x1fffffff);
              uVar12 = (ulong)((uVar1 << 0x1d ^ uVar17) & 0x20000000);
              *(ulong *)pGVar9 = uVar12 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar11;
              *(ulong *)pGVar9 =
                   uVar12 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
                   (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
              pGVar18 = p_00->pObjs;
              if ((pGVar9 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar9)) goto LAB_0070544a;
              Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar9 - (long)pGVar18) >> 2) * -0x55555555
                         );
              lVar15 = local_38;
              p = local_48;
              if (p_00->pFanData != (int *)0x0) {
                Gia_ObjAddFanout(p_00,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),
                                 pGVar9);
              }
              pGVar18 = p_00->pObjs;
              if ((pGVar9 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar9)) goto LAB_0070544a;
              iVar2 = (int)((ulong)((long)pGVar9 - (long)pGVar18) >> 2) * 0x55555556;
              pGVar18 = local_40;
              goto LAB_00705330;
            }
            if (p->vMapping->nSize <= lVar15) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->vMapping->pArray[lVar15] != 0) {
              iVar2 = Gia_ObjPerformBidec(local_58,p_00,p,
                                          (Gia_Obj_t *)(&pGVar18->field_0x0 + lVar16),local_50,
                                          vTruth,pVVar3);
              goto LAB_00705330;
            }
          }
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 0xc;
        } while (lVar15 < p->nObjs);
      }
      Bdc_ManFree(local_58);
      Gia_ManHashStop(p_00);
      iVar2 = Gia_ManHasDangling(p_00);
      if (iVar2 != 0) {
        pGVar10 = Gia_ManCleanup(p_00);
        if (~(pGVar10->vCos->nSize + pGVar10->vCis->nSize) + pGVar10->nObjs !=
            ~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs) {
          printf("Gia_ManPerformBidec() node count before and after: %6d and %6d.\n");
        }
        Gia_ManStop(p_00);
        p_00 = pGVar10;
      }
      Gia_ManSetRegNum(p_00,p->nRegs);
      __ptr = local_50;
      if (local_50->pArray != (int *)0x0) {
        free(local_50->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
      if (vTruth->pArray != (int *)0x0) {
        free(vTruth->pArray);
        vTruth->pArray = (int *)0x0;
      }
      free(vTruth);
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
        pVVar3->pArray = (int *)0x0;
      }
      free(pVVar3);
      return p_00;
    }
    pcVar13 = "Resynthesis is not performed when nodes have more than 15 inputs.";
  }
  puts(pcVar13);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformBidec( Gia_Man_t * p, int fVerbose )
{
    Bdc_Man_t * pManDec;
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;//, clk = Abc_Clock();
    pPars->nVarsMax = Gia_ManLutSizeMax( p );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax < 2 )
    {
        printf( "Resynthesis is not performed when nodes have less than 2 inputs.\n" );
        return NULL;
    }
    if ( pPars->nVarsMax > 15 )
    {
        printf( "Resynthesis is not performed when nodes have more than 15 inputs.\n" );
        return NULL;
    }
    vLeaves  = Vec_IntAlloc( 0 );
    vTruth   = Vec_IntAlloc( (1<<16) );
    vVisited = Vec_IntAlloc( 0 );
    // clean the old manager
    Gia_ManCleanTruth( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
//    Gia_ManCleanLevels( pNew, Gia_ManObjNum(p) );
    pManDec = Bdc_ManAlloc( pPars );
    Gia_ManForEachObj1( p, pObj, i )
    {        
        if ( Gia_ObjIsCi(pObj) ) // transfer the CI level (is it needed?)
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsLut(p, i) )
            pObj->Value = Gia_ObjPerformBidec( pManDec, pNew, p, pObj, vLeaves, vTruth, vVisited );
    }
    Bdc_ManFree( pManDec );
    // cleanup the AIG
    Gia_ManHashStop( pNew );
    // check the presence of dangling nodes
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        if ( Gia_ManAndNum(pNew) != Gia_ManAndNum(pTemp) )
            printf( "Gia_ManPerformBidec() node count before and after: %6d and %6d.\n", Gia_ManAndNum(pNew), Gia_ManAndNum(pTemp) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    if ( fVerbose )
    {
//        printf( "Total gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pNew) );
//        ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
    return pNew;
}